

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

Hashtable * __thiscall icu_63::ICUService::getVisibleIDMap(ICUService *this,UErrorCode *status)

{
  UBool UVar1;
  Hashtable *pHVar2;
  long *plVar3;
  Hashtable *p;
  Hashtable *local_60;
  ICUServiceFactory *f;
  int32_t pos;
  ICUService *ncthis;
  UErrorCode *status_local;
  ICUService *this_local;
  
  p = (Hashtable *)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->idCache == (Hashtable *)0x0) {
      pHVar2 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)p);
      local_60 = (Hashtable *)0x0;
      if (pHVar2 != (Hashtable *)0x0) {
        p = (Hashtable *)status;
        Hashtable::Hashtable(pHVar2,status);
        local_60 = pHVar2;
      }
      this->idCache = local_60;
      if (this->idCache == (Hashtable *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else if (this->factories != (UVector *)0x0) {
        f._0_4_ = UVector::size(this->factories);
        while (f._0_4_ = (int32_t)f + -1, -1 < (int32_t)f) {
          plVar3 = (long *)UVector::elementAt(this->factories,(int32_t)f);
          p = this->idCache;
          (**(code **)(*plVar3 + 0x20))(plVar3,p,status);
        }
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') {
          pHVar2 = this->idCache;
          if (pHVar2 != (Hashtable *)0x0) {
            Hashtable::~Hashtable(pHVar2);
            UMemory::operator_delete((UMemory *)pHVar2,p);
          }
          this->idCache = (Hashtable *)0x0;
        }
      }
    }
    this_local = (ICUService *)this->idCache;
  }
  else {
    this_local = (ICUService *)0x0;
  }
  return (Hashtable *)this_local;
}

Assistant:

const Hashtable* 
ICUService::getVisibleIDMap(UErrorCode& status) const {
    if (U_FAILURE(status)) return NULL;

    // must only be called when lock is already held

    ICUService* ncthis = (ICUService*)this; // cast away semantic const
    if (idCache == NULL) {
        ncthis->idCache = new Hashtable(status);
        if (idCache == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else if (factories != NULL) {
            for (int32_t pos = factories->size(); --pos >= 0;) {
                ICUServiceFactory* f = (ICUServiceFactory*)factories->elementAt(pos);
                f->updateVisibleIDs(*idCache, status);
            }
            if (U_FAILURE(status)) {
                delete idCache;
                ncthis->idCache = NULL;
            }
        }
    }

    return idCache;
}